

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

EVaction INT_EVassoc_split_action(CManager_conflict cm,EVstone stone_num,EVstone *target_stone_list)

{
  int iVar1;
  FILE *out;
  _proto_action *p_Var2;
  long in_RDX;
  long in_RDI;
  bool bVar3;
  CManager unaff_retaddr;
  int i;
  int target_count;
  int action_num;
  stone_type stone;
  event_path_data evp;
  event_path_data in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  uint uVar4;
  CManager_conflict cm_00;
  CMTraceType in_stack_fffffffffffffffc;
  uint uVar5;
  
  cm_00 = *(CManager_conflict *)(in_RDI + 0x118);
  uVar4 = 0;
  out = (FILE *)stone_struct(in_stack_ffffffffffffffb8,0);
  if (out == (FILE *)0x0) {
    uVar5 = 0xffffffff;
  }
  else {
    uVar5 = *(uint *)&out->_IO_save_base;
    p_Var2 = (_proto_action *)
             INT_CMrealloc((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           (size_t)in_stack_ffffffffffffffb8);
    out->_IO_backup_base = (char *)p_Var2;
    memset((_proto_action *)out->_IO_backup_base + (int)uVar5,0,0x60);
    ((_proto_action *)out->_IO_backup_base)[(int)uVar5].action_type = Action_Split;
    while( true ) {
      bVar3 = false;
      if (in_RDX != 0) {
        bVar3 = *(int *)(in_RDX + (long)(int)uVar4 * 4) != -1;
      }
      if (!bVar3) break;
      uVar4 = uVar4 + 1;
    }
    iVar1 = CMtrace_val[10];
    if (*(long *)(in_RDI + 0x120) == 0) {
      iVar1 = CMtrace_init(unaff_retaddr,in_stack_fffffffffffffffc);
    }
    if (iVar1 != 0) {
      fprintf(*(FILE **)(in_RDI + 0x120),"Adding Split action %d to ",(ulong)uVar5);
      fprint_stone_identifier(out,(event_path_data)CONCAT44(uVar5,uVar4),in_stack_ffffffffffffffc4);
      fprintf(*(FILE **)(in_RDI + 0x120),", %d target stones -> ",(ulong)uVar4);
      for (iVar1 = 0; iVar1 < (int)uVar4; iVar1 = iVar1 + 1) {
        fprintf(*(FILE **)(in_RDI + 0x120),"%x, ",(ulong)*(uint *)(in_RDX + (long)iVar1 * 4));
      }
      fprintf(*(FILE **)(in_RDI + 0x120),"\n");
    }
    for (iVar1 = 0; iVar1 < (int)uVar4; iVar1 = iVar1 + 1) {
      INT_EVstone_add_split_target(cm_00,(EVstone)((ulong)out >> 0x20),(EVstone)out);
    }
    *(uint *)&out->_chain = uVar4;
    *(uint *)&out->field_0x4 = uVar5;
    *(int *)&out->_IO_save_base = *(int *)&out->_IO_save_base + 1;
    clear_response_cache((stone_type)0x13e125);
  }
  return uVar5;
}

Assistant:

extern EVaction
INT_EVassoc_split_action(CManager cm, EVstone stone_num, 
		     EVstone *target_stone_list)
{
    event_path_data evp = cm->evp;
    stone_type stone;
    int action_num;
    int target_count = 0, i;

    stone = stone_struct(evp, stone_num);
    if (!stone) return -1;

    action_num = stone->proto_action_count;
    stone->proto_actions = realloc(stone->proto_actions, 
				   (action_num + 1) * 
				   sizeof(stone->proto_actions[0]));
    memset(&stone->proto_actions[action_num], 0, 
	   sizeof(stone->proto_actions[0]));
    stone->proto_actions[action_num].action_type = Action_Split;
    while (target_stone_list && (target_stone_list[target_count] != -1)) {
	target_count++;
    }
    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Adding Split action %d to ", action_num);
	fprint_stone_identifier(cm->CMTrace_file, evp, stone_num);
	fprintf(cm->CMTrace_file, ", %d target stones -> ", target_count);
	for (i=0; i < target_count; i++) {
	    fprintf(cm->CMTrace_file, "%x, ", target_stone_list[i]);
	}
	fprintf(cm->CMTrace_file, "\n");
    }
    for (i=0; i < target_count; i++) {
	INT_EVstone_add_split_target(cm, stone_num, target_stone_list[i]);
    }
    stone->output_count = target_count;
    stone->default_action = action_num;
    stone->proto_action_count++;
    clear_response_cache(stone);
    return action_num;
}